

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

utf_error utf8::internal::validate_next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         end,uint32_t *code_point)

{
  bool bVar1;
  utf_error uVar2;
  difference_type length;
  uint cp_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lead_it;
  uint32_t cp;
  
  lead_it = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )it->_M_current;
  cp = 0;
  length = sequence_length<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(lead_it);
  switch(length) {
  case 0:
    return INVALID_LEAD;
  case 1:
    if (it->_M_current == end._M_current) {
      uVar2 = NOT_ENOUGH_ROOM;
      goto LAB_00561efe;
    }
    cp = (uint32_t)(byte)*it->_M_current;
    cp_00 = cp;
    goto LAB_00561eb8;
  case 2:
    uVar2 = get_sequence_2<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end,&cp);
    break;
  case 3:
    uVar2 = get_sequence_3<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end,&cp);
    break;
  case 4:
    uVar2 = get_sequence_4<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end,&cp);
    break;
  default:
    cp_00 = 0;
    goto LAB_00561eb8;
  }
  cp_00 = cp;
  if (uVar2 == UTF8_OK) {
LAB_00561eb8:
    if ((cp_00 & 0xfffff800) == 0xd800 || 0x10ffff < cp_00) {
      uVar2 = INVALID_CODE_POINT;
    }
    else {
      bVar1 = is_overlong_sequence<long>(cp_00,length);
      if (bVar1) {
        uVar2 = OVERLONG_SEQUENCE;
      }
      else {
        *code_point = cp;
        lead_it._M_current = it->_M_current + 1;
        uVar2 = UTF8_OK;
      }
    }
  }
LAB_00561efe:
  it->_M_current = (char *)lead_it;
  return uVar2;
}

Assistant:

utf_error validate_next(octet_iterator& it, octet_iterator end, uint32_t& code_point)
    {
        // Save the original value of it so we can go back in case of failure
        // Of course, it does not make much sense with i.e. stream iterators
        octet_iterator original_it = it;

        uint32_t cp = 0;
        // Determine the sequence length based on the lead octet
        typedef typename std::iterator_traits<octet_iterator>::difference_type octet_difference_type;
        const octet_difference_type length = utf8::internal::sequence_length(it);

        // Get trail octets and calculate the code point
        utf_error err = UTF8_OK;
        switch (length) {
            case 0: 
                return INVALID_LEAD;
            case 1:
                err = utf8::internal::get_sequence_1(it, end, cp);
                break;
            case 2:
                err = utf8::internal::get_sequence_2(it, end, cp);
            break;
            case 3:
                err = utf8::internal::get_sequence_3(it, end, cp);
            break;
            case 4:
                err = utf8::internal::get_sequence_4(it, end, cp);
            break;
        }

        if (err == UTF8_OK) {
            // Decoding succeeded. Now, security checks...
            if (utf8::internal::is_code_point_valid(cp)) {
                if (!utf8::internal::is_overlong_sequence(cp, length)){
                    // Passed! Return here.
                    code_point = cp;
                    ++it;
                    return UTF8_OK;
                }
                else
                    err = OVERLONG_SEQUENCE;
            }
            else 
                err = INVALID_CODE_POINT;
        }

        // Failure branch - restore the original value of the iterator
        it = original_it;
        return err;
    }